

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

int32 vector_normalize(vector_t v,uint32 dim)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  
  if (dim == 0) {
    return -2;
  }
  fVar1 = 0.0;
  uVar3 = 0;
  do {
    fVar1 = fVar1 + (float)v[uVar3];
    uVar3 = uVar3 + 1;
  } while (dim != uVar3);
  if (fVar1 == 0.0 || dim == 0) {
    iVar2 = (-(uint)(fVar1 != 0.0) & 1) * 2 + -2;
  }
  else {
    iVar2 = 0;
    uVar3 = 0;
    do {
      v[uVar3] = (float32)((float)v[uVar3] / fVar1);
      uVar3 = uVar3 + 1;
    } while (dim != uVar3);
  }
  return iVar2;
}

Assistant:

int
vector_normalize(vector_t v, uint32 dim)
{
    uint32 i;
    float64 s;
    int ret_val = S3_SUCCESS;

    for (i = 0, s = 0; i < dim; i++)
        s += v[i];

    if (s != 0) {
        for (i = 0; i < dim; i++)
            v[i] /= (float) s;
    }
    else {
        ret_val = S3_WARNING;
    }

    return ret_val;
}